

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesHelper.cxx
# Opt level: O3

shared_ptr<cmDebugger::cmDebuggerVariables> __thiscall
cmDebugger::cmDebuggerVariablesHelper::CreateIfAny
          (cmDebuggerVariablesHelper *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,vector<cmFileSet_*,_std::allocator<cmFileSet_*>_> *fileSets)

{
  pointer ppcVar1;
  cmDebuggerVariables *this_00;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  pointer ppcVar2;
  shared_ptr<cmDebugger::cmDebuggerVariables> sVar3;
  bool local_49;
  cmDebuggerVariablesHelper *local_48;
  cmDebuggerVariablesHelper local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((fileSets->super__Vector_base<cmFileSet_*,_std::allocator<cmFileSet_*>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (fileSets->super__Vector_base<cmFileSet_*,_std::allocator<cmFileSet_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(undefined8 *)this = 0;
    local_48 = this + 8;
    local_49 = supportsVariableType;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cmDebugger::cmDebuggerVariables,std::allocator<cmDebugger::cmDebuggerVariables>,std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_48,(cmDebuggerVariables **)this,
               (allocator<cmDebugger::cmDebuggerVariables> *)local_40,variablesManager,name,
               &local_49);
    ppcVar2 = (fileSets->super__Vector_base<cmFileSet_*,_std::allocator<cmFileSet_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar1 = (fileSets->super__Vector_base<cmFileSet_*,_std::allocator<cmFileSet_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    name = extraout_RDX;
    if (ppcVar2 != ppcVar1) {
      do {
        this_00 = *(cmDebuggerVariables **)this;
        CreateIfAny(local_40,variablesManager,&(*ppcVar2)->Name,local_49,*ppcVar2);
        cmDebuggerVariables::AddSubVariables
                  (this_00,(shared_ptr<cmDebugger::cmDebuggerVariables> *)local_40);
        name = extraout_RDX_00;
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          name = extraout_RDX_01;
        }
        ppcVar2 = ppcVar2 + 1;
      } while (ppcVar2 != ppcVar1);
    }
  }
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerVariables>)
         sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerVariables> cmDebuggerVariablesHelper::CreateIfAny(
  std::shared_ptr<cmDebuggerVariablesManager> const& variablesManager,
  std::string const& name, bool supportsVariableType,
  std::vector<cmFileSet*> const& fileSets)
{
  if (fileSets.empty()) {
    return {};
  }

  auto fileSetsVariables = std::make_shared<cmDebuggerVariables>(
    variablesManager, name, supportsVariableType);

  for (auto const& fileSet : fileSets) {
    fileSetsVariables->AddSubVariables(CreateIfAny(
      variablesManager, fileSet->GetName(), supportsVariableType, fileSet));
  }

  return fileSetsVariables;
}